

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# association.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_weakValueAssociation_create
          (sysbvm_context_t *context,sysbvm_tuple_t key,sysbvm_tuple_t value)

{
  sysbvm_tuple_header_t *header;
  sysbvm_object_tuple_t *psVar1;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).weakValueAssociationType,2);
  if (((ulong)psVar1 & 0xf) == 0 && psVar1 != (sysbvm_object_tuple_t *)0x0) {
    (psVar1->header).identityHashAndFlags =
         (psVar1->header).identityHashAndFlags & 0xfffffcff | 0x100;
  }
  (psVar1->field_1).pointers[0] = key;
  psVar1[1].header.field_0.typePointer = value;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_weakValueAssociation_create(sysbvm_context_t *context, sysbvm_tuple_t key, sysbvm_tuple_t value)
{
    sysbvm_weakValueAssociation_t *result = (sysbvm_weakValueAssociation_t*)sysbvm_context_allocatePointerTuple(context, context->roots.weakValueAssociationType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_weakValueAssociation_t));
    sysbvm_tuple_markWeakObject((sysbvm_tuple_t)result);
    result->key = key;
    result->value = value;
    return (sysbvm_tuple_t)result;
}